

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_haptic2.cpp
# Opt level: O0

void get_all_haptics(void)

{
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  ulong uVar4;
  ALLEGRO_HAPTIC *pAVar5;
  char *pcVar6;
  char *name;
  ALLEGRO_JOYSTICK *joy;
  int i;
  ALLEGRO_DISPLAY *display;
  int local_c;
  
  num_haptics = 0;
  uVar3 = al_get_current_display();
  uVar4 = al_is_display_haptic(uVar3);
  if ((uVar4 & 1) != 0) {
    pAVar5 = (ALLEGRO_HAPTIC *)al_get_haptic_from_display(uVar3);
    haptics[num_haptics].haptic = pAVar5;
    if (haptics[num_haptics].haptic != (ALLEGRO_HAPTIC *)0x0) {
      haptics[num_haptics].name = "display";
      haptics[num_haptics].playing = false;
      num_haptics = num_haptics + 1;
    }
  }
  local_c = 0;
  while( true ) {
    bVar1 = false;
    if (num_haptics < 8) {
      iVar2 = al_get_num_joysticks();
      bVar1 = local_c < iVar2;
    }
    if (!bVar1) break;
    uVar3 = al_get_joystick(local_c);
    uVar4 = al_is_joystick_haptic(uVar3);
    if ((uVar4 & 1) != 0) {
      pAVar5 = (ALLEGRO_HAPTIC *)al_get_haptic_from_joystick(uVar3);
      haptics[num_haptics].haptic = pAVar5;
      if (haptics[num_haptics].haptic != (ALLEGRO_HAPTIC *)0x0) {
        pcVar6 = (char *)al_get_joystick_name(uVar3);
        haptics[num_haptics].name = pcVar6;
        haptics[num_haptics].playing = false;
        num_haptics = num_haptics + 1;
      }
    }
    local_c = local_c + 1;
  }
  return;
}

Assistant:

static void get_all_haptics() {
   num_haptics = 0;
   ALLEGRO_DISPLAY * display = al_get_current_display();

   if (al_is_display_haptic(display)) {
      haptics[num_haptics].haptic = al_get_haptic_from_display(display);
      if (haptics[num_haptics].haptic) {
         haptics[num_haptics].name = (const char *)"display";
         haptics[num_haptics].playing = false;
         num_haptics++;
      }
   }

   for (int i = 0;
      num_haptics < EX_MAX_HAPTICS && i < al_get_num_joysticks();
      i++)
   {
      ALLEGRO_JOYSTICK *joy = al_get_joystick(i);
      if (al_is_joystick_haptic(joy)) {
         haptics[num_haptics].haptic = al_get_haptic_from_joystick(joy);
         if (haptics[num_haptics].haptic) {
            const char *name = al_get_joystick_name(joy);
            haptics[num_haptics].name = (const char *)name;
            haptics[num_haptics].playing = false;
            num_haptics++;
         }
      }
   }

}